

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StructureAnalyzer.cpp
# Opt level: O3

vector<dg::vr::BorderValue,_std::allocator<dg::vr::BorderValue>_> * __thiscall
dg::vr::StructureAnalyzer::getBorderValuesFor(StructureAnalyzer *this,Function *func)

{
  StructureAnalyzer *pSVar1;
  StructureAnalyzer *pSVar2;
  StructureAnalyzer *pSVar3;
  
  pSVar2 = *(StructureAnalyzer **)(this + 0x140);
  pSVar1 = this + 0x138;
  pSVar3 = pSVar1;
  if (pSVar2 != (StructureAnalyzer *)0x0) {
    do {
      if (*(Function **)(pSVar2 + 0x20) >= func) {
        pSVar3 = pSVar2;
      }
      pSVar2 = *(StructureAnalyzer **)
                (pSVar2 + (ulong)(*(Function **)(pSVar2 + 0x20) < func) * 8 + 0x10);
    } while (pSVar2 != (StructureAnalyzer *)0x0);
    if ((pSVar3 != pSVar1) && (*(Function **)(pSVar3 + 0x20) <= func)) {
      pSVar1 = pSVar3;
    }
  }
  return (vector<dg::vr::BorderValue,_std::allocator<dg::vr::BorderValue>_> *)(pSVar1 + 0x28);
}

Assistant:

const std::vector<BorderValue> &
StructureAnalyzer::getBorderValuesFor(const llvm::Function *func) const {
    assert(hasBorderValues(func));
    return borderValues.find(func)->second;
}